

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O1

void __thiscall
jrtplib::RTPSources::MultipleTimeouts
          (RTPSources *this,RTPTime *curtime,RTPTime *sendertimeout,RTPTime *byetimeout,
          RTPTime *generaltimeout,RTPTime *notetimeout)

{
  RTPTime *pRVar1;
  bool bVar2;
  RTPInternalSourceData *this_00;
  HashElement *pHVar3;
  RTPMemoryManager *pRVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  HashElement *pHVar10;
  HashElement *pHVar11;
  byte bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  int local_64;
  int local_60;
  
  dVar13 = curtime->m_t;
  dVar14 = dVar13 - sendertimeout->m_t;
  dVar15 = dVar13 - byetimeout->m_t;
  dVar16 = dVar13 - generaltimeout->m_t;
  dVar13 = dVar13 - notetimeout->m_t;
  pHVar10 = (this->sourcelist).firsthashelem;
  (this->sourcelist).curhashelem = pHVar10;
  if (pHVar10 == (HashElement *)0x0) {
    local_60 = 0;
    local_64 = 0;
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    local_64 = 0;
    local_60 = 0;
    do {
      this_00 = pHVar10->element;
      bVar2 = (this_00->super_RTPSourceData).issender;
      bVar12 = ((this_00->super_RTPSourceData).receivedbye ^ 1U) &
               (this_00->super_RTPSourceData).validated;
      if ((this_00->super_RTPSourceData).SDESinf.nonprivateitems[6].length == 0) {
        bVar7 = false;
      }
      else {
        pRVar1 = &(this_00->super_RTPSourceData).stats.lastnotetime;
        bVar5 = dVar13 != pRVar1->m_t;
        bVar6 = pRVar1->m_t <= dVar13;
        bVar7 = bVar6 && bVar5;
        if (bVar6 && bVar5) {
          RTPInternalSourceData::ClearNote(this_00);
        }
      }
      if ((this_00->super_RTPSourceData).receivedbye == true) {
        bVar5 = false;
        if ((this_00 != this->owndata) &&
           (pRVar1 = &(this_00->super_RTPSourceData).byetime,
           pRVar1->m_t <= dVar15 && dVar15 != pRVar1->m_t)) {
          pHVar10 = (this->sourcelist).curhashelem;
          bVar5 = true;
          if (pHVar10 != (HashElement *)0x0) {
            pHVar11 = pHVar10->hashprev;
            pHVar3 = pHVar10->hashnext;
            if (pHVar11 == (HashElement *)0x0) {
              (this->sourcelist).table[pHVar10->hashindex] = pHVar3;
              if (pHVar3 != (HashElement *)0x0) {
                pHVar11 = (HashElement *)0x0;
                goto LAB_0011f0db;
              }
            }
            else {
              pHVar11->hashnext = pHVar3;
              if (pHVar3 != (HashElement *)0x0) {
LAB_0011f0db:
                pHVar3->hashprev = pHVar11;
              }
            }
            pHVar10 = (this->sourcelist).curhashelem;
            pHVar11 = pHVar10->listprev;
            pHVar3 = pHVar10->listnext;
            if (pHVar11 == (HashElement *)0x0) {
              (this->sourcelist).firsthashelem = pHVar3;
              if (pHVar3 == (HashElement *)0x0) {
                (this->sourcelist).lasthashelem = (HashElement *)0x0;
              }
              else {
                pHVar3->listprev = (HashElement *)0x0;
              }
            }
            else {
              pHVar11->listnext = pHVar3;
              if (pHVar3 == (HashElement *)0x0) {
                (this->sourcelist).lasthashelem = pHVar11;
              }
              else {
                pHVar3->listprev = pHVar11;
              }
            }
            pRVar4 = (this->sourcelist).super_RTPMemoryObject.mgr;
            if (pRVar4 == (RTPMemoryManager *)0x0) {
              if (pHVar10 != (HashElement *)0x0) {
                operator_delete(pHVar10,0x30);
              }
            }
            else {
              (**(code **)(*(long *)pRVar4 + 0x18))(pRVar4,pHVar10);
            }
            (this->sourcelist).curhashelem = pHVar3;
          }
        }
      }
      else {
        bVar5 = false;
      }
      bVar8 = false;
      bVar6 = bVar5;
      if (((!bVar5) && (this_00 != this->owndata)) &&
         (pRVar1 = &(this_00->super_RTPSourceData).stats.lastmsgtime,
         pRVar1->m_t <= dVar16 && dVar16 != pRVar1->m_t)) {
        pHVar10 = (this->sourcelist).curhashelem;
        if (pHVar10 == (HashElement *)0x0) {
          bVar8 = true;
          bVar6 = true;
        }
        else {
          pHVar11 = pHVar10->hashprev;
          pHVar3 = pHVar10->hashnext;
          if (pHVar11 == (HashElement *)0x0) {
            (this->sourcelist).table[pHVar10->hashindex] = pHVar3;
            if (pHVar3 != (HashElement *)0x0) {
              pHVar11 = (HashElement *)0x0;
              goto LAB_0011f2df;
            }
          }
          else {
            pHVar11->hashnext = pHVar3;
            if (pHVar3 != (HashElement *)0x0) {
LAB_0011f2df:
              pHVar3->hashprev = pHVar11;
            }
          }
          pHVar10 = (this->sourcelist).curhashelem;
          pHVar11 = pHVar10->listprev;
          pHVar3 = pHVar10->listnext;
          if (pHVar11 == (HashElement *)0x0) {
            (this->sourcelist).firsthashelem = pHVar3;
            if (pHVar3 == (HashElement *)0x0) {
              (this->sourcelist).lasthashelem = (HashElement *)0x0;
            }
            else {
              pHVar3->listprev = (HashElement *)0x0;
            }
          }
          else {
            pHVar11->listnext = pHVar3;
            if (pHVar3 == (HashElement *)0x0) {
              (this->sourcelist).lasthashelem = pHVar11;
            }
            else {
              pHVar3->listprev = pHVar11;
            }
          }
          pRVar4 = (this->sourcelist).super_RTPMemoryObject.mgr;
          if (pRVar4 == (RTPMemoryManager *)0x0) {
            if (pHVar10 != (HashElement *)0x0) {
              operator_delete(pHVar10,0x30);
            }
          }
          else {
            (**(code **)(*(long *)pRVar4 + 0x18))(pRVar4,pHVar10);
          }
          (this->sourcelist).curhashelem = pHVar3;
          bVar8 = true;
          bVar6 = true;
        }
      }
      if (bVar6) {
        if (bVar2 != false) {
          this->sendercount = this->sendercount + -1;
        }
        if (bVar12 != 0) {
          this->activecount = this->activecount + -1;
        }
        this->totalcount = this->totalcount + -1;
        if (bVar5) {
          (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[9])(this,this_00);
        }
        if (bVar8) {
          (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[8])(this,this_00);
        }
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[7])(this,this_00);
        pRVar4 = (this->super_RTPMemoryObject).mgr;
        if (pRVar4 == (RTPMemoryManager *)0x0) {
          if (this_00 != (RTPInternalSourceData *)0x0) {
            (*(this_00->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject[1])
                      (this_00);
          }
        }
        else {
          (**(this_00->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject)(this_00);
          (**(code **)(*(long *)pRVar4 + 0x18))(pRVar4,this_00);
        }
      }
      else {
        if (bVar2 != false) {
          pRVar1 = &(this_00->super_RTPSourceData).stats.lastrtptime;
          if (dVar14 < pRVar1->m_t || dVar14 == pRVar1->m_t) {
            local_64 = local_64 + 1;
          }
          else {
            (this_00->super_RTPSourceData).issender = false;
            this->sendercount = this->sendercount + -1;
          }
        }
        if (bVar7) {
          (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x12])(this,this_00);
        }
        iVar9 = iVar9 + 1;
        local_60 = local_60 + (uint)bVar12;
        pHVar10 = (this->sourcelist).curhashelem;
        if (pHVar10 != (HashElement *)0x0) {
          (this->sourcelist).curhashelem = pHVar10->listnext;
        }
      }
      pHVar10 = (this->sourcelist).curhashelem;
    } while (pHVar10 != (HashElement *)0x0);
  }
  this->totalcount = iVar9;
  this->sendercount = local_64;
  this->activecount = local_60;
  return;
}

Assistant:

void RTPSources::MultipleTimeouts(const RTPTime &curtime,const RTPTime &sendertimeout,const RTPTime &byetimeout,const RTPTime &generaltimeout,const RTPTime &notetimeout)
{
	int newtotalcount = 0;
	int newsendercount = 0;
	int newactivecount = 0;
	RTPTime senderchecktime = curtime;
	RTPTime byechecktime = curtime;
	RTPTime generaltchecktime = curtime;
	RTPTime notechecktime = curtime;
	senderchecktime -= sendertimeout;
	byechecktime -= byetimeout;
	generaltchecktime -= generaltimeout;
	notechecktime -= notetimeout;
	
	sourcelist.GotoFirstElement();
	while (sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *srcdat = sourcelist.GetCurrentElement();
		bool deleted,issender,isactive;
		bool byetimeout,normaltimeout,notetimeout;
		
		size_t notelen;
		
		issender = srcdat->IsSender();
		isactive = srcdat->IsActive();
		deleted = false;
		byetimeout = false;
		normaltimeout = false;
		notetimeout = false;

        	srcdat->SDES_GetNote(&notelen);
		if (notelen != 0) // Note has been set
		{
			RTPTime notetime = srcdat->INF_GetLastSDESNoteTime();
			
			if (notechecktime > notetime)
			{
				notetimeout = true;
				srcdat->ClearNote();
			}
		}

		if (srcdat->ReceivedBYE())
		{
			RTPTime byetime = srcdat->GetBYETime();

			if ((srcdat != owndata) && (byechecktime > byetime))
			{
				sourcelist.DeleteCurrentElement();
				deleted = true;
				byetimeout = true;
			}
		}

		if (!deleted)
		{
			RTPTime lastmsgtime = srcdat->INF_GetLastMessageTime();

			if ((srcdat != owndata) && (lastmsgtime < generaltchecktime))
			{
				sourcelist.DeleteCurrentElement();
				deleted = true;
				normaltimeout = true;
			}
		}
		
		if (!deleted)
		{
			newtotalcount++;
			
			if (issender)
			{
				RTPTime lastrtppacktime = srcdat->INF_GetLastRTPPacketTime();

				if (lastrtppacktime < senderchecktime)
				{
					srcdat->ClearSenderFlag();
					sendercount--;
				}
				else
					newsendercount++;
			}

			if (isactive)
				newactivecount++;

			if (notetimeout)
				OnNoteTimeout(srcdat);

			sourcelist.GotoNextElement();
		}
		else // deleted entry
		{
			if (issender)
				sendercount--;
			if (isactive)
				activecount--;
			totalcount--;

			if (byetimeout)
				OnBYETimeout(srcdat);
			if (normaltimeout)
				OnTimeout(srcdat);
			OnRemoveSource(srcdat);
			RTPDelete(srcdat,GetMemoryManager());
		}
	}	
	
#ifdef RTPDEBUG
	if (newtotalcount != totalcount)
	{
		SafeCountTotal();
		std::cout << "New total count " << newtotalcount << " doesnt match old total count " << totalcount << std::endl;
	}
	if (newsendercount != sendercount)
	{
		SafeCountSenders();
		std::cout << "New sender count " << newsendercount << " doesnt match old sender count " << sendercount << std::endl;
	}
	if (newactivecount != activecount)
	{
		std::cout << "New active count " << newactivecount << " doesnt match old active count " << activecount << std::endl;
		SafeCountActive();
	}
#endif // RTPDEBUG
	
	totalcount = newtotalcount; // just to play it safe
	sendercount = newsendercount;
	activecount = newactivecount;
}